

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O0

void __thiscall
Indexing::
SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>>::Lhs>
::
Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier*,Indexing::RetrievalAlgorithms::VarBanksN<0u>>>
::Iterator<Kernel::TypedTermList,Kernel::AbstractingUnifier*,Kernel::AbstractionOracle,bool>
          (Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
           *this,SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Lhs>
                 *parent,Node *root,TypedTermList query,bool retrieveSubstitution,bool reversed,
          AbstractingUnifier *args,AbstractionOracle args_1,bool args_2)

{
  TypedTermList query_00;
  byte bVar1;
  byte bVar2;
  Node *in_RCX;
  byte bVar3;
  SortId in_RDX;
  UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>
  *in_RDI;
  SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Lhs>
  *in_R8;
  byte in_R9B;
  byte in_stack_00000008;
  undefined4 in_stack_00000018;
  byte in_stack_00000020;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
  *in_stack_ffffffffffffffa8;
  AbstractionOracle in_stack_ffffffffffffffb4;
  undefined5 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffd8;
  
  bVar3 = in_R9B & 1;
  bVar2 = in_stack_00000008 & 1;
  bVar1 = in_stack_00000020 & 1;
  RetrievalAlgorithms::
  UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>
  ::UnificationWithAbstraction(in_RDI);
  Lib::Stack<unsigned_int>::Stack
            ((Stack<unsigned_int> *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
             CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  Lib::
  Option<Lib::VirtualIterator<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Lhs_*>_>
  ::Option((Option<Lib::VirtualIterator<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Lhs_*>_>
            *)0xb6b8b3);
  Lib::
  Stack<Lib::VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Lhs>::Node_**>_>
  ::Stack((Stack<Lib::VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Lhs>::Node_**>_>
           *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
          CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  Lib::BacktrackData::BacktrackData((BacktrackData *)&in_RDI[6]._fixedPointIteration);
  Lib::Stack<Lib::BacktrackData>::Stack
            ((Stack<Lib::BacktrackData> *)
             CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
             CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  Lib::BacktrackData::BacktrackData((BacktrackData *)&in_RDI[9]._fixedPointIteration);
  InstanceCntr::InstanceCntr((InstanceCntr *)(in_RDI + 10));
  query_00.super_TermList._content._5_1_ = bVar1;
  query_00.super_TermList._content._0_5_ = in_stack_ffffffffffffffb8;
  query_00.super_TermList._content._6_1_ = bVar2;
  query_00.super_TermList._content._7_1_ = bVar3;
  query_00._sort._content = in_RDX._content;
  init<Kernel::TypedTermList,Kernel::AbstractingUnifier*,Kernel::AbstractionOracle,bool>
            (in_stack_ffffffffffffffa8,in_R8,in_RCX,query_00,
             SUB41((uint)in_stack_00000018 >> 0x18,0),SUB41((uint)in_stack_00000018 >> 0x10,0),
             (AbstractingUnifier *)CONCAT44(in_stack_00000018,in_stack_ffffffffffffffd8),
             in_stack_ffffffffffffffb4,SUB41((uint)in_stack_00000018 >> 8,0));
  return;
}

Assistant:

Iterator(SubstitutionTree* parent, Node* root, TermOrLit query, bool retrieveSubstitution, bool reversed, AlgoArgs... args)
       : _algo()
      { init(parent, root, query, retrieveSubstitution, reversed, std::move(args)...); }